

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilderCmd.cpp
# Opt level: O1

int cmdline_parser_file_save(char *filename,gengetopt_args_info *args_info)

{
  int iVar1;
  FILE *__stream;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"%s: cannot open file for writing: %s\n","randomBuilder",filename);
    iVar1 = 1;
  }
  else {
    iVar1 = cmdline_parser_dump((FILE *)__stream,args_info);
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

int
cmdline_parser_file_save(const char *filename, struct gengetopt_args_info *args_info)
{
  FILE *outfile;
  int i = 0;

  outfile = fopen(filename, "w");

  if (!outfile)
    {
      fprintf (stderr, "%s: cannot open file for writing: %s\n", CMDLINE_PARSER_PACKAGE, filename);
      return EXIT_FAILURE;
    }

  i = cmdline_parser_dump(outfile, args_info);
  fclose (outfile);

  return i;
}